

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertorsTestCase.cpp
# Opt level: O2

void __thiscall
SuiteFieldConvertorsTests::TestutcTimeStampConvertFromSecond::RunImpl
          (TestutcTimeStampConvertFromSecond *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  int local_60;
  int local_5c;
  TestDetails local_58;
  UtcTimeStamp result2;
  UtcTimeStamp result;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"20000426-12:05:06",(allocator<char> *)&result2);
  FIX::UtcTimeStampConvertor::convert(&result,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  result2.super_DateTime._vptr_DateTime._0_4_ = 0xc;
  local_60 = (int)(result.super_DateTime.m_time / 3600000000000);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_58,*ppTVar3,0x11f);
  UnitTest::CheckEqual<int,int>(pTVar1,(int *)&result2,&local_60,&local_58);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  result2.super_DateTime._vptr_DateTime._0_4_ = 5;
  local_60 = (int)((long)((ulong)(uint)((int)(result.super_DateTime.m_time / 60000000000) >> 0x1f)
                          << 0x20 | result.super_DateTime.m_time / 60000000000 & 0xffffffffU) % 0x3c
                  );
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_58,*ppTVar3,0x120);
  UnitTest::CheckEqual<int,int>(pTVar1,(int *)&result2,&local_60,&local_58);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  result2.super_DateTime._vptr_DateTime._0_4_ = 6;
  local_60 = (int)((result.super_DateTime.m_time / 1000000000) % 0x3c);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_58,*ppTVar3,0x121);
  UnitTest::CheckEqual<int,int>(pTVar1,(int *)&result2,&local_60,&local_58);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  result2.super_DateTime._vptr_DateTime._0_4_ = 0;
  local_60 = 0;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_58,*ppTVar3,0x122);
  UnitTest::CheckEqual<int,int>(pTVar1,(int *)&result2,&local_60,&local_58);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  result2.super_DateTime._vptr_DateTime._0_4_ = 2000;
  local_60 = FIX::DateTime::getYear(&result.super_DateTime);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_58,*ppTVar3,0x123);
  UnitTest::CheckEqual<int,int>(pTVar1,(int *)&result2,&local_60,&local_58);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  result2.super_DateTime._vptr_DateTime._0_4_ = 4;
  local_60 = FIX::DateTime::getMonth(&result.super_DateTime);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_58,*ppTVar3,0x124);
  UnitTest::CheckEqual<int,int>(pTVar1,(int *)&result2,&local_60,&local_58);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  result2.super_DateTime._vptr_DateTime._0_4_ = 0x1a;
  local_60 = FIX::DateTime::getDay(&result.super_DateTime);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_58,*ppTVar3,0x125);
  UnitTest::CheckEqual<int,int>(pTVar1,(int *)&result2,&local_60,&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"20000426-12:05:06",(allocator<char> *)&local_60);
  FIX::UtcTimeStampConvertor::convert(&result2,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_60 = 0xc;
  local_5c = (int)(result2.super_DateTime.m_time / 3600000000000);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_58,*ppTVar3,0x129);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_60,&local_5c,&local_58);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_60 = 5;
  local_5c = (int)((long)((ulong)(uint)((int)(result2.super_DateTime.m_time / 60000000000) >> 0x1f)
                          << 0x20 | result2.super_DateTime.m_time / 60000000000 & 0xffffffffU) %
                  0x3c);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_58,*ppTVar3,0x12a);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_60,&local_5c,&local_58);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_60 = 6;
  local_5c = (int)((result2.super_DateTime.m_time / 1000000000) % 0x3c);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_58,*ppTVar3,299);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_60,&local_5c,&local_58);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_60 = 0;
  local_5c = 0;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_58,*ppTVar3,300);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_60,&local_5c,&local_58);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_60 = 2000;
  local_5c = FIX::DateTime::getYear(&result2.super_DateTime);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_58,*ppTVar3,0x12d);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_60,&local_5c,&local_58);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_60 = 4;
  local_5c = FIX::DateTime::getMonth(&result2.super_DateTime);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_58,*ppTVar3,0x12e);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_60,&local_5c,&local_58);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_60 = 0x1a;
  local_5c = FIX::DateTime::getDay(&result2.super_DateTime);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_58,*ppTVar3,0x12f);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_60,&local_5c,&local_58);
  return;
}

Assistant:

TEST(utcTimeStampConvertFromSecond)
{
  UtcTimeStamp result = UtcTimeStampConvertor::convert
    ( std::string( "20000426-12:05:06" ) );
  CHECK_EQUAL( 12, result.getHour() );
  CHECK_EQUAL( 5, result.getMinute() );
  CHECK_EQUAL( 6, result.getSecond() );
  CHECK_EQUAL( 0, result.getFraction(0) );
  CHECK_EQUAL( 2000, result.getYear() );
  CHECK_EQUAL( 4, result.getMonth() );
  CHECK_EQUAL( 26, result.getDate() );

  UtcTimeStamp result2 = UtcTimeStampConvertor::convert
    ( std::string( "20000426-12:05:06" ) );
  CHECK_EQUAL( 12, result2.getHour() );
  CHECK_EQUAL( 5, result2.getMinute() );
  CHECK_EQUAL( 6, result2.getSecond() );
  CHECK_EQUAL( 0, result2.getFraction(0) );
  CHECK_EQUAL( 2000, result2.getYear() );
  CHECK_EQUAL( 4, result2.getMonth() );
  CHECK_EQUAL( 26, result2.getDate() );
}